

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O3

void __thiscall soplex::SPxBasisBase<double>::reDim(SPxBasisBase<double> *this)

{
  SPxOut *pSVar1;
  char cVar2;
  undefined8 in_RAX;
  int newsize;
  Verbosity old_verbosity;
  undefined8 local_28;
  
  local_28 = in_RAX;
  Desc::reSize(&this->thedesc,
               (this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.
               super_SVSetBase<double>.set.thenum,
               (this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.
               super_SVSetBase<double>.set.thenum);
  newsize = (this->theLP->thecovectors->set).thenum;
  if (newsize != (this->matrix).thesize) {
    pSVar1 = this->spxout;
    if ((pSVar1 != (SPxOut *)0x0) && (4 < (int)pSVar1->m_verbosity)) {
      local_28 = CONCAT44(pSVar1->m_verbosity,5);
      (*pSVar1->_vptr_SPxOut[2])();
      pSVar1 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity],
                 "ICHBAS02 basis redimensioning invalidates factorization",0x37);
      cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18)
                      + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,(long)&local_28 + 4);
      newsize = (this->theLP->thecovectors->set).thenum;
    }
    DataArray<const_soplex::SVectorBase<double>_*>::reSize(&this->matrix,newsize);
    DataArray<soplex::SPxId>::reSize(&this->theBaseId,(this->theLP->thecovectors->set).thenum);
    this->matrixIsSetup = false;
    this->factorized = false;
  }
  return;
}

Assistant:

void SPxBasisBase<R>::reDim()
{

   assert(theLP != nullptr);

   SPxOut::debug(this, "DCHBAS01 SPxBasisBase<R>::reDim(): matrixIsSetup={}, factorized={}\n",
                 matrixIsSetup, factorized);

   thedesc.reSize(theLP->nRows(), theLP->nCols());

   if(theLP->dim() != matrix.size())
   {
      SPX_MSG_INFO3((*this->spxout), (*this->spxout) <<
                    "ICHBAS02 basis redimensioning invalidates factorization"
                    << std::endl;)

      matrix.reSize(theLP->dim());
      theBaseId.reSize(theLP->dim());
      matrixIsSetup = false;
      factorized    = false;
   }

   SPxOut::debug(this, "DCHBAS03 SPxBasisBase<R>::reDim(): --> matrixIsSetup={}, factorized={}\n",
                 matrixIsSetup, factorized);

   assert(matrix.size()    >= theLP->dim());
   assert(theBaseId.size() >= theLP->dim());
}